

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreationTest.cpp
# Opt level: O0

void __thiscall TApp_PreSpaces_Test::TestBody(TApp_PreSpaces_Test *this)

{
  bool bVar1;
  Option *pOVar2;
  char *pcVar3;
  char *in_R9;
  string local_1d0;
  AssertHelper local_1b0;
  Message local_1a8;
  allocator local_199;
  string local_198;
  bool local_171;
  undefined1 local_170 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_140;
  Message local_138;
  allocator local_129;
  string local_128;
  bool local_101;
  undefined1 local_100 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_d0;
  Message local_c8;
  allocator local_b9;
  string local_b8;
  bool local_91;
  undefined1 local_90 [8];
  AssertionResult gtest_ar_;
  string local_78;
  allocator local_41;
  string local_40;
  Option *local_20;
  Option *myapp;
  TApp_PreSpaces_Test *pTStack_10;
  int x;
  TApp_PreSpaces_Test *this_local;
  
  pTStack_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40," -a, --long, other",&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_78,"",(allocator *)((long)&gtest_ar_.message_.ptr_ + 7));
  pOVar2 = CLI::App::add_option<int,_(CLI::detail::enabler)0>
                     (&(this->super_TApp).app,&local_40,(int *)((long)&myapp + 4),&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  local_20 = pOVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b8,"long",&local_b9);
  local_91 = CLI::Option::check_lname(pOVar2,&local_b8);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_90,&local_91,(type *)0x0)
  ;
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(&local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_90,
               (AssertionResult *)"myapp->check_lname(\"long\")","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
               ,0x108,pcVar3);
    testing::internal::AssertHelper::operator=(&local_d0,&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  pOVar2 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_128,"a",&local_129);
  local_101 = CLI::Option::check_sname(pOVar2,&local_128);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_100,&local_101,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
  if (!bVar1) {
    testing::Message::Message(&local_138);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_100,
               (AssertionResult *)"myapp->check_sname(\"a\")","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
               ,0x109,pcVar3);
    testing::internal::AssertHelper::operator=(&local_140,&local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_138);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
  pOVar2 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_198,"other",&local_199);
  local_171 = CLI::Option::check_name(pOVar2,&local_198);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_170,&local_171,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator((allocator<char> *)&local_199);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
  if (!bVar1) {
    testing::Message::Message(&local_1a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1d0,(internal *)local_170,(AssertionResult *)"myapp->check_name(\"other\")",
               "false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
               ,0x10a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1b0,&local_1a8);
    testing::internal::AssertHelper::~AssertHelper(&local_1b0);
    std::__cxx11::string::~string((string *)&local_1d0);
    testing::Message::~Message(&local_1a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
  return;
}

Assistant:

TEST_F(TApp, PreSpaces) {
    int x;
    auto myapp = app.add_option(" -a, --long, other", x);

    EXPECT_TRUE(myapp->check_lname("long"));
    EXPECT_TRUE(myapp->check_sname("a"));
    EXPECT_TRUE(myapp->check_name("other"));
}